

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

plink * Plink_new(void)

{
  plink *ppVar1;
  int local_14;
  int amt;
  int i;
  plink *newlink;
  
  if (plink_freelist == (plink *)0x0) {
    plink_freelist = (plink *)calloc(100,0x10);
    if (plink_freelist == (plink *)0x0) {
      fprintf(_stderr,"Unable to allocate memory for a new follow-set propagation link.\n");
      exit(1);
    }
    for (local_14 = 0; local_14 < 99; local_14 = local_14 + 1) {
      plink_freelist[local_14].next = plink_freelist + (local_14 + 1);
    }
    plink_freelist[99].next = (plink *)0x0;
  }
  ppVar1 = plink_freelist;
  plink_freelist = plink_freelist->next;
  return ppVar1;
}

Assistant:

struct plink *Plink_new(){
  struct plink *newlink;

  if( plink_freelist==0 ){
    int i;
    int amt = 100;
    plink_freelist = (struct plink *)calloc( amt, sizeof(struct plink) );
    if( plink_freelist==0 ){
      fprintf(stderr,
      "Unable to allocate memory for a new follow-set propagation link.\n");
      exit(1);
    }
    for(i=0; i<amt-1; i++) plink_freelist[i].next = &plink_freelist[i+1];
    plink_freelist[amt-1].next = 0;
  }
  newlink = plink_freelist;
  plink_freelist = plink_freelist->next;
  return newlink;
}